

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O0

void msd_D<std::deque<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,
               deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets)

{
  size_type sVar1;
  reference pvVar2;
  uint local_27c;
  uint local_278;
  uint i_4;
  uint i_3;
  uint i_2;
  size_t pos;
  undefined1 local_260 [4];
  uint i_1;
  array<unsigned_short,_256UL> bucketsize;
  uint j_1;
  uint j;
  uchar cache [32];
  ulong local_30;
  size_t i;
  deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets_local;
  size_t depth_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
  }
  else {
    for (local_30 = 0; local_30 < n - (n & 0x1f); local_30 = local_30 + 0x20) {
      bucketsize._M_elems[0xfe] = 0;
      bucketsize._M_elems[0xff] = 0;
      for (; (uint)bucketsize._M_elems._508_4_ < 0x20;
          bucketsize._M_elems._508_4_ = bucketsize._M_elems._508_4_ + 1) {
        *(uchar *)((long)&j_1 + (ulong)(uint)bucketsize._M_elems._508_4_) =
             strings[local_30 + (uint)bucketsize._M_elems._508_4_][depth];
      }
      bucketsize._M_elems[0xfc] = 0;
      bucketsize._M_elems[0xfd] = 0;
      for (; (uint)bucketsize._M_elems._504_4_ < 0x20;
          bucketsize._M_elems._504_4_ = bucketsize._M_elems._504_4_ + 1) {
        std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                  (buckets + *(byte *)((long)&j_1 + (ulong)(uint)bucketsize._M_elems._504_4_),
                   strings + local_30 + (uint)bucketsize._M_elems._504_4_);
      }
    }
    for (; local_30 < n; local_30 = local_30 + 1) {
      std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                (buckets + strings[local_30][depth],strings + local_30);
    }
    for (pos._4_4_ = 0; pos._4_4_ < 0x100; pos._4_4_ = pos._4_4_ + 1) {
      sVar1 = std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size
                        (buckets + pos._4_4_);
      pvVar2 = std::array<unsigned_short,_256UL>::operator[]
                         ((array<unsigned_short,_256UL> *)local_260,(ulong)pos._4_4_);
      *pvVar2 = (value_type_conflict2)sVar1;
    }
    _i_3 = 0;
    for (i_4 = 0; i_4 < 0x100; i_4 = i_4 + 1) {
      pvVar2 = std::array<unsigned_short,_256UL>::operator[]
                         ((array<unsigned_short,_256UL> *)local_260,(ulong)i_4);
      if (*pvVar2 != 0) {
        copy<std::deque<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char**>
                  (buckets + i_4,strings + _i_3);
        pvVar2 = std::array<unsigned_short,_256UL>::operator[]
                           ((array<unsigned_short,_256UL> *)local_260,(ulong)i_4);
        _i_3 = *pvVar2 + _i_3;
      }
    }
    for (local_278 = 0; local_278 < 0x100; local_278 = local_278 + 1) {
      std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::clear(buckets + local_278);
    }
    pvVar2 = std::array<unsigned_short,_256UL>::operator[]
                       ((array<unsigned_short,_256UL> *)local_260,0);
    _i_3 = (ulong)*pvVar2;
    for (local_27c = 1; local_27c < 0x100; local_27c = local_27c + 1) {
      pvVar2 = std::array<unsigned_short,_256UL>::operator[]
                         ((array<unsigned_short,_256UL> *)local_260,(ulong)local_27c);
      if (*pvVar2 != 0) {
        pvVar2 = std::array<unsigned_short,_256UL>::operator[]
                           ((array<unsigned_short,_256UL> *)local_260,(ulong)local_27c);
        msd_D<std::deque<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                  (strings + _i_3,(ulong)*pvVar2,depth + 1,buckets);
        pvVar2 = std::array<unsigned_short,_256UL>::operator[]
                           ((array<unsigned_short,_256UL> *)local_260,(ulong)local_27c);
        _i_3 = *pvVar2 + _i_3;
      }
    }
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}